

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O0

void helper_xssqrtqp(CPUPPCState_conflict *env,uint32_t opcode,ppc_vsr_t *xt,ppc_vsr_t *xb)

{
  uint32_t uVar1;
  int iVar2;
  float128 fVar3;
  uintptr_t unaff_retaddr;
  float_status local_70;
  uint64_t local_68;
  float_status local_60;
  uint64_t local_58;
  float_status local_50;
  uint64_t local_48;
  float_status local_40;
  float_status tstat;
  ppc_vsr_t t;
  ppc_vsr_t *xb_local;
  ppc_vsr_t *xt_local;
  uint32_t opcode_local;
  CPUPPCState_conflict *env_local;
  
  memset(&tstat,0,0x10);
  helper_reset_fpstatus(env);
  local_40 = env->fp_status;
  uVar1 = Rc(opcode);
  if (uVar1 != 0) {
    local_40.float_rounding_mode = '\x05';
  }
  set_float_exception_flags(0,&local_40);
  fVar3 = float128_sqrt_ppc(xb->f128,&local_40);
  local_50 = (float_status)fVar3.low;
  tstat = local_50;
  local_48 = fVar3.high;
  t.u64[0] = local_48;
  (env->fp_status).float_exception_flags =
       (env->fp_status).float_exception_flags | local_40.float_exception_flags;
  if (((ulong)local_40 & 0x10000) != 0) {
    iVar2 = float128_is_signaling_nan_ppc(xb->f128,&local_40);
    if (iVar2 == 0) {
      iVar2 = float128_is_quiet_nan_ppc(xb->f128,&local_40);
      if (iVar2 == 0) {
        iVar2 = float128_is_neg(xb->f128);
        if ((iVar2 != 0) && (iVar2 = float128_is_zero(xb->f128), iVar2 == 0)) {
          float_invalid_op_vxsqrt(env,true,unaff_retaddr);
          fVar3 = float128_default_nan_ppc(&env->fp_status);
          local_70 = (float_status)fVar3.low;
          tstat = local_70;
          local_68 = fVar3.high;
          t.u64[0] = local_68;
        }
      }
      else {
        tstat = (float_status)xb->u64[0];
        t.u64[0] = xb->u64[1];
      }
    }
    else {
      float_invalid_op_vxsnan(env,unaff_retaddr);
      fVar3 = float128_snan_to_qnan(xb->f128);
      local_60 = (float_status)fVar3.low;
      tstat = local_60;
      local_58 = fVar3.high;
      t.u64[0] = local_58;
    }
  }
  fVar3.high = t.u64[0];
  fVar3.low._0_1_ = tstat.float_detect_tininess;
  fVar3.low._1_1_ = tstat.float_rounding_mode;
  fVar3.low._2_1_ = tstat.float_exception_flags;
  fVar3.low._3_1_ = tstat.floatx80_rounding_precision;
  fVar3.low._4_1_ = tstat.flush_to_zero;
  fVar3.low._5_1_ = tstat.flush_inputs_to_zero;
  fVar3.low._6_1_ = tstat.default_nan_mode;
  fVar3.low._7_1_ = tstat.snan_bit_is_one;
  helper_compute_fprf_float128(env,fVar3);
  xt->u64[0] = (uint64_t)tstat;
  xt->u64[1] = t.u64[0];
  do_float_check_status(env,unaff_retaddr);
  return;
}

Assistant:

void helper_xssqrtqp(CPUPPCState *env, uint32_t opcode,
                     ppc_vsr_t *xt, ppc_vsr_t *xb)
{
    ppc_vsr_t t = { 0 };
    float_status tstat;

    helper_reset_fpstatus(env);

    tstat = env->fp_status;
    if (unlikely(Rc(opcode) != 0)) {
        tstat.float_rounding_mode = float_round_to_odd;
    }

    set_float_exception_flags(0, &tstat);
    t.f128 = float128_sqrt(xb->f128, &tstat);
    env->fp_status.float_exception_flags |= tstat.float_exception_flags;

    if (unlikely(tstat.float_exception_flags & float_flag_invalid)) {
        if (float128_is_signaling_nan(xb->f128, &tstat)) {
            float_invalid_op_vxsnan(env, GETPC());
            t.f128 = float128_snan_to_qnan(xb->f128);
        } else if (float128_is_quiet_nan(xb->f128, &tstat)) {
            t.f128 = xb->f128;
        } else if (float128_is_neg(xb->f128) && !float128_is_zero(xb->f128)) {
            float_invalid_op_vxsqrt(env, 1, GETPC());
            t.f128 = float128_default_nan(&env->fp_status);
        }
    }

    helper_compute_fprf_float128(env, t.f128);
    *xt = t;
    do_float_check_status(env, GETPC());
}